

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode hostname_check(Curl_URL *u,char *hostname)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *local_58;
  char *h;
  char local_48 [4];
  int i;
  char zoneid [16];
  size_t hlen;
  size_t len;
  char *l;
  char *hostname_local;
  Curl_URL *u_local;
  
  len = 0;
  zoneid._8_8_ = strlen(hostname);
  l = hostname;
  if (*hostname == '[') {
    l = hostname + 1;
    len = (size_t)anon_var_dwarf_ef08d9;
    zoneid._8_8_ = zoneid._8_8_ - 2;
  }
  if (len == 0) {
    sVar3 = strcspn(l," ");
    if (zoneid._8_8_ != sVar3) {
      return CURLUE_MALFORMED_INPUT;
    }
  }
  else {
    sVar3 = strspn(l,(char *)len);
    if (zoneid._8_8_ != sVar3) {
      if (l[sVar3] != '%') {
        return CURLUE_MALFORMED_INPUT;
      }
      h._4_4_ = 0;
      local_58 = l + sVar3 + 1;
      iVar2 = strncmp(local_58,"25",2);
      if (((iVar2 == 0) && (local_58[2] != '\0')) && (local_58[2] != ']')) {
        local_58 = local_58 + 2;
      }
      while( true ) {
        bVar1 = false;
        if ((*local_58 != '\0') && (bVar1 = false, *local_58 != ']')) {
          bVar1 = h._4_4_ < 0xf;
        }
        if (!bVar1) break;
        local_48[h._4_4_] = *local_58;
        local_58 = local_58 + 1;
        h._4_4_ = h._4_4_ + 1;
      }
      if ((h._4_4_ == 0) || (*local_58 != ']')) {
        return CURLUE_MALFORMED_INPUT;
      }
      local_48[h._4_4_] = '\0';
      pcVar4 = (*Curl_cstrdup)(local_48);
      u->zoneid = pcVar4;
      if (u->zoneid == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      l[sVar3] = ']';
      l[sVar3 + 1] = '\0';
    }
  }
  if (*l == '\0') {
    u_local._4_4_ = CURLUE_NO_HOST;
  }
  else {
    u_local._4_4_ = CURLUE_OK;
  }
  return u_local._4_4_;
}

Assistant:

static CURLUcode hostname_check(struct Curl_URL *u, char *hostname)
{
  const char *l = NULL; /* accepted characters */
  size_t len;
  size_t hlen = strlen(hostname);

  if(hostname[0] == '[') {
    hostname++;
    l = "0123456789abcdefABCDEF::.";
    hlen -= 2;
  }

  if(l) {
    /* only valid letters are ok */
    len = strspn(hostname, l);
    if(hlen != len) {
      if(hostname[len] == '%') {
        /* this could now be '%[zone id]' */
        char zoneid[16];
        int i = 0;
        char *h = &hostname[len + 1];
        /* pass '25' if present and is a url encoded percent sign */
        if(!strncmp(h, "25", 2) && h[2] && (h[2] != ']'))
          h += 2;
        while(*h && (*h != ']') && (i < 15))
          zoneid[i++] = *h++;
        if(!i || (']' != *h))
          return CURLUE_MALFORMED_INPUT;
        zoneid[i] = 0;
        u->zoneid = strdup(zoneid);
        if(!u->zoneid)
          return CURLUE_OUT_OF_MEMORY;
        hostname[len] = ']'; /* insert end bracket */
        hostname[len + 1] = 0; /* terminate the hostname */
      }
      else
        return CURLUE_MALFORMED_INPUT;
      /* hostname is fine */
    }
  }
  else {
    /* letters from the second string is not ok */
    len = strcspn(hostname, " ");
    if(hlen != len)
      /* hostname with bad content */
      return CURLUE_MALFORMED_INPUT;
  }
  if(!hostname[0])
    return CURLUE_NO_HOST;
  return CURLUE_OK;
}